

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O0

wchar_t file_open(archive *a,void *client_data)

{
  wchar_t wVar1;
  int *piVar2;
  uint *puVar3;
  int *in_RSI;
  archive *in_RDI;
  char *mbs;
  wchar_t *wcs;
  stat_conflict st;
  write_file_data *mine;
  wchar_t flags;
  wchar_t **in_stack_ffffffffffffff08;
  archive_mstring *in_stack_ffffffffffffff10;
  int bytes;
  archive *in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  archive *in_stack_ffffffffffffff28;
  uint local_a0;
  int iVar4;
  wchar_t local_4;
  
  iVar4 = 0x80241;
  wVar1 = archive_mstring_get_mbs
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     (char **)in_stack_ffffffffffffff08);
  if (wVar1 == L'\0') {
    iVar4 = open((char *)0x0,iVar4,0x1b6);
    bytes = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    *in_RSI = iVar4;
    __archive_ensure_cloexec_flag(0);
    if (*in_RSI < 0) {
      puVar3 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar3,"Failed to open \'%S\'",0);
      local_4 = L'\xffffffe2';
    }
    else {
      iVar4 = fstat(*in_RSI,(stat *)&stack0xffffffffffffff48);
      if (iVar4 == 0) {
        iVar4 = archive_write_get_bytes_in_last_block(in_stack_ffffffffffffff18);
        if (iVar4 < 0) {
          if ((((local_a0 & 0xf000) == 0x2000) || ((local_a0 & 0xf000) == 0x6000)) ||
             ((local_a0 & 0xf000) == 0x1000)) {
            archive_write_set_bytes_in_last_block(in_stack_ffffffffffffff18,bytes);
          }
          else {
            archive_write_set_bytes_in_last_block(in_stack_ffffffffffffff18,bytes);
          }
        }
        if ((local_a0 & 0xf000) == 0x8000) {
          archive_write_set_skip_file
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     (int64_t)in_stack_ffffffffffffff18);
        }
        local_4 = L'\0';
      }
      else {
        puVar3 = (uint *)__errno_location();
        archive_set_error(in_RDI,(int)(ulong)*puVar3,"Couldn\'t stat \'%S\'",0);
        local_4 = L'\xffffffe2';
      }
    }
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      puVar3 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar3,"No memory");
    }
    else {
      archive_mstring_get_wcs
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      puVar3 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar3,"Can\'t convert \'%S\' to MBS",0);
    }
    local_4 = L'\xffffffe2';
  }
  return local_4;
}

Assistant:

static int
file_open(struct archive *a, void *client_data)
{
	struct write_fd_data *mine;
	struct stat st;

	mine = (struct write_fd_data *)client_data;

	if (fstat(mine->fd, &st) != 0) {
		archive_set_error(a, errno, "Couldn't stat fd %d", mine->fd);
		return (ARCHIVE_FATAL);
	}

	/*
	 * If this is a regular file, don't add it to itself.
	 */
	if (S_ISREG(st.st_mode))
		archive_write_set_skip_file(a, st.st_dev, st.st_ino);

	/*
	 * If client hasn't explicitly set the last block handling,
	 * then set it here.
	 */
	if (archive_write_get_bytes_in_last_block(a) < 0) {
		/* If the output is a block or character device, fifo,
		 * or stdout, pad the last block, otherwise leave it
		 * unpadded. */
		if (S_ISCHR(st.st_mode) || S_ISBLK(st.st_mode) ||
		    S_ISFIFO(st.st_mode) || (mine->fd == 1))
			/* Last block will be fully padded. */
			archive_write_set_bytes_in_last_block(a, 0);
		else
			archive_write_set_bytes_in_last_block(a, 1);
	}

	return (ARCHIVE_OK);
}